

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::chromeCallLoggingExit
          (CLIntercept *this,char *functionName,string *tag,bool includeId,uint64_t enqueueCounter,
          time_point tickStart,time_point tickEnd)

{
  CChromeTracer *this_00;
  CLIntercept *this_01;
  type startTime;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> delta;
  uint64_t id;
  type this_02;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> this_03;
  ulong uVar1;
  byte in_CL;
  CLIntercept *in_RDI;
  uint64_t nsDelta;
  uint64_t nsStart;
  uint64_t threadId;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff28;
  lock_guard<std::mutex> *in_stack_ffffffffffffff30;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff38;
  uint64_t in_stack_ffffffffffffff58;
  type name;
  type id_00;
  duration<long,_std::ratio<1L,_1000000000L>_> local_68;
  uint64_t local_60;
  CLIntercept *local_48;
  byte local_29;
  
  local_29 = in_CL & 1;
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  this_00 = (CChromeTracer *)OS(in_RDI);
  this_01 = (CLIntercept *)::OS::Services_Common::GetThreadID((Services_Common *)0x1f7a23);
  local_48 = this_01;
  getThreadNumber(this_01,in_stack_ffffffffffffff58);
  startTime = std::chrono::operator-
                        (in_stack_ffffffffffffff38,
                         (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)in_stack_ffffffffffffff30);
  id_00 = startTime;
  delta = std::chrono::
          duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffff28);
  local_68.__r = delta.__r;
  id = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_68);
  local_60 = id;
  this_02 = std::chrono::operator-
                      (in_stack_ffffffffffffff38,
                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)in_stack_ffffffffffffff30);
  name = this_02;
  this_03 = std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffff28);
  std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
            ((duration<long,_std::ratio<1L,_1000000000L>_> *)&stack0xffffffffffffff80);
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) == 0) && ((local_29 & 1) != 0)) {
    CChromeTracer::addCallLogging
              ((CChromeTracer *)this_03.__r,(char *)name.__r,(string *)this_00,(uint64_t)in_RDI,
               (uint64_t)this_01,startTime.__r,id_00.__r);
  }
  else {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      CChromeTracer::addCallLogging
                ((CChromeTracer *)this_03.__r,(char *)name.__r,(string *)this_00,(uint64_t)in_RDI,
                 (uint64_t)this_01,startTime.__r);
    }
    else if ((local_29 & 1) == 0) {
      CChromeTracer::addCallLogging
                (this_00,(char *)in_RDI,(uint64_t)this_01,startTime.__r,delta.__r);
    }
    else {
      CChromeTracer::addCallLogging
                (this_00,(char *)in_RDI,(uint64_t)this_01,startTime.__r,delta.__r,id);
    }
  }
  if (((in_RDI->m_Config).FlushFiles & 1U) != 0) {
    CChromeTracer::flush((CChromeTracer *)this_02.__r);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1f7c7c);
  return;
}

Assistant:

void CLIntercept::chromeCallLoggingExit(
    const char* functionName,
    const std::string& tag,
    bool includeId,
    const uint64_t enqueueCounter,
    clock::time_point tickStart,
    clock::time_point tickEnd )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    uint64_t    threadId = OS().GetThreadID();

    // This will name the thread if it is not named already.
    getThreadNumber( threadId );

    using ns = std::chrono::nanoseconds;
    uint64_t    nsStart =
        std::chrono::duration_cast<ns>(tickStart - m_StartTime).count();
    uint64_t    nsDelta =
        std::chrono::duration_cast<ns>(tickEnd - tickStart).count();

    if( !tag.empty() && includeId )
    {
        m_ChromeTrace.addCallLogging( functionName, tag, threadId, nsStart, nsDelta, enqueueCounter );
    }
    else if( !tag.empty() )
    {
        m_ChromeTrace.addCallLogging( functionName, tag, threadId, nsStart, nsDelta );
    }
    else if( includeId )
    {
        m_ChromeTrace.addCallLogging( functionName, threadId, nsStart, nsDelta, enqueueCounter );
    }
    else
    {
        m_ChromeTrace.addCallLogging( functionName, threadId, nsStart, nsDelta );
    }

    if( m_Config.FlushFiles )
    {
        m_ChromeTrace.flush();
    }
}